

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_zip_entry_read(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  long lVar2;
  jx9_value *pjVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) || (lVar2 = ((*apArg)->x).iVal, lVar2 == 0)
      ) || (*(int *)(lVar2 + 0xa0) != -0x21529ca6)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,"Expecting a ZIP archive entry");
  }
  else if (*(uint *)(lVar2 + 8) < *(uint *)(lVar2 + 4)) {
    uVar5 = 0x400;
    if (nArg != 1) {
      pjVar3 = apArg[1];
      jx9MemObjToInteger(pjVar3);
      uVar6 = *(uint *)&pjVar3->x;
      uVar5 = 0x400;
      if (0 < (int)uVar6) {
        uVar5 = uVar6;
      }
    }
    iVar1 = *(int *)(lVar2 + 8);
    uVar6 = *(int *)(lVar2 + 4) - iVar1;
    if (uVar5 < uVar6) {
      uVar6 = uVar5;
    }
    lVar4 = *(long *)(*(int **)(lVar2 + 0x98) + (ulong)(**(int **)(lVar2 + 0x98) == 2) * 2 + 2);
    *(uint *)(lVar2 + 8) = uVar6 + iVar1;
    jx9_value_string(pCtx->pRet,(char *)((ulong)(uint)(iVar1 + *(int *)(lVar2 + 0x48)) + lVar4),
                     uVar6);
    return 0;
  }
  pjVar3 = pCtx->pRet;
  jx9MemObjRelease(pjVar3);
  (pjVar3->x).rVal = 0.0;
  pjVar3->iFlags = pjVar3->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_zip_entry_read(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pEntry;
	zip_raw_data *pRaw;
	const char *zData;
	int iLength;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid ZIP archive entry */
	pEntry = (SyArchiveEntry *)jx9_value_to_resource(apArg[0]);
	if( SXARCH_ENTRY_INVALID(pEntry) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	zData = 0;
	if( pEntry->nReadCount >= pEntry->nByteCompr ){
		/* No more data to read, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Set a default read length */
	iLength = 1024;
	if( nArg > 1 ){
		iLength = jx9_value_to_int(apArg[1]);
		if( iLength < 1 ){
			iLength = 1024;
		}
	}
	if( (sxu32)iLength > pEntry->nByteCompr - pEntry->nReadCount ){
		iLength = (int)(pEntry->nByteCompr - pEntry->nReadCount);
	}
	/* Return the entry contents */
	pRaw = (zip_raw_data *)pEntry->pUserData;
	if( pRaw->iType == ZIP_RAW_DATA_MEMBUF ){
		zData = (const char *)SyBlobDataAt(&pRaw->raw.sBlob, (pEntry->nOfft+pEntry->nReadCount));
	}else{
		const char *zMap = (const char *)pRaw->raw.mmap.pMap;
		/* Memory mmaped chunk */
		zData = &zMap[pEntry->nOfft+pEntry->nReadCount];
	}
	/* Increment the read counter */
	pEntry->nReadCount += iLength;
	/* Return the raw data */
	jx9_result_string(pCtx, zData, iLength);
	return JX9_OK;
}